

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O0

void __thiscall UdpSocket::Implementation::Bind(Implementation *this,IpEndpointName *localEndpoint)

{
  int iVar1;
  runtime_error *this_00;
  undefined1 local_28 [8];
  sockaddr_in bindSockAddr;
  IpEndpointName *localEndpoint_local;
  Implementation *this_local;
  
  bindSockAddr.sin_zero = (uchar  [8])localEndpoint;
  SockaddrFromIpEndpointName((sockaddr_in *)local_28,localEndpoint);
  iVar1 = bind(this->socket_,(sockaddr *)local_28,0x10);
  if (iVar1 < 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unable to bind udp socket\n");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->isBound_ = true;
  return;
}

Assistant:

void Bind( const IpEndpointName& localEndpoint )
	{
		struct sockaddr_in bindSockAddr;
		SockaddrFromIpEndpointName( bindSockAddr, localEndpoint );

        if (bind(socket_, (struct sockaddr *)&bindSockAddr, sizeof(bindSockAddr)) < 0) {
            throw std::runtime_error("unable to bind udp socket\n");
        }

		isBound_ = true;
	}